

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * __thiscall
testing::internal::FilePath::RemoveFileName(FilePath *__return_storage_ptr__,FilePath *this)

{
  char *__s;
  long lVar1;
  char *pcVar2;
  allocator<char> local_6d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string dir;
  char *last_sep;
  FilePath *this_local;
  
  dir.field_2._8_8_ = FindLastPathSeparator(this);
  std::__cxx11::string::string((string *)local_40);
  if (dir.field_2._8_8_ == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"./");
  }
  else {
    __s = c_str(this);
    lVar1 = dir.field_2._8_8_ + 1;
    pcVar2 = c_str(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,__s,lVar1 - (long)pcVar2,local_6d);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               &local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(local_6d);
  }
  FilePath(__return_storage_ptr__,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), static_cast<size_t>(last_sep + 1 - c_str()));
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}